

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int mbedtls_ccm_crypt(mbedtls_ccm_context *ctx,size_t offset,size_t use_len,uchar *input,
                     uchar *output)

{
  uchar local_58 [8];
  uchar tmp_buf [16];
  size_t sStack_40;
  int ret;
  size_t olen;
  uchar *output_local;
  uchar *input_local;
  size_t use_len_local;
  size_t offset_local;
  mbedtls_ccm_context *ctx_local;
  
  sStack_40 = 0;
  tmp_buf[0xc] = 0x92;
  tmp_buf[0xd] = 0xff;
  tmp_buf[0xe] = 0xff;
  tmp_buf[0xf] = 0xff;
  olen = (size_t)output;
  output_local = input;
  input_local = (uchar *)use_len;
  use_len_local = offset;
  offset_local = (size_t)ctx;
  memset(local_58,0,0x10);
  tmp_buf._12_4_ =
       mbedtls_cipher_update
                 ((mbedtls_cipher_context_t *)(offset_local + 0x48),(uchar *)(offset_local + 0x10),
                  0x10,local_58,&stack0xffffffffffffffc0);
  if (tmp_buf._12_4_ == 0) {
    mbedtls_xor((uchar *)olen,output_local,local_58 + use_len_local,(size_t)input_local);
    mbedtls_platform_zeroize(local_58,0x10);
    ctx_local._4_1_ = tmp_buf[0xc];
    ctx_local._5_1_ = tmp_buf[0xd];
    ctx_local._6_1_ = tmp_buf[0xe];
    ctx_local._7_1_ = tmp_buf[0xf];
  }
  else {
    *(uint *)(offset_local + 0x98) = *(uint *)(offset_local + 0x98) | 0x10;
    mbedtls_platform_zeroize(local_58,0x10);
    ctx_local._4_1_ = tmp_buf[0xc];
    ctx_local._5_1_ = tmp_buf[0xd];
    ctx_local._6_1_ = tmp_buf[0xe];
    ctx_local._7_1_ = tmp_buf[0xf];
  }
  return ctx_local._4_4_;
}

Assistant:

static int mbedtls_ccm_crypt(mbedtls_ccm_context *ctx,
                             size_t offset, size_t use_len,
                             const unsigned char *input,
                             unsigned char *output)
{
    size_t olen = 0;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char tmp_buf[16] = { 0 };

    if ((ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->ctr, 16, tmp_buf,
                                     &olen)) != 0) {
        ctx->state |= CCM_STATE__ERROR;
        mbedtls_platform_zeroize(tmp_buf, sizeof(tmp_buf));
        return ret;
    }

    mbedtls_xor(output, input, tmp_buf + offset, use_len);

    mbedtls_platform_zeroize(tmp_buf, sizeof(tmp_buf));
    return ret;
}